

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure::~IfcRelContainedInSpatialStructure
          (IfcRelContainedInSpatialStructure *this)

{
  void *pvVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  size_type *psVar4;
  
  this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Name.ptr.field_2.
  _M_allocated_capacity = (size_type)&PTR__IfcRelContainedInSpatialStructure_008e6d30;
  (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.OwnerHistory.obj =
       (LazyObject *)&PTR__IfcRelContainedInSpatialStructure_008e6dd0;
  this[-1].RelatingStructure.obj = (LazyObject *)&PTR__IfcRelContainedInSpatialStructure_008e6d58;
  *(undefined ***)&this[-1].field_0xe0 = &PTR__IfcRelContainedInSpatialStructure_008e6d80;
  (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcRelContainedInSpatialStructure_008e6da8;
  pvVar1 = *(void **)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->super_IfcRelConnects).super_IfcRelationship.
                                     super_IfcRoot.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                     field_0x20 - (long)pvVar1);
  }
  this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Name.ptr.field_2.
  _M_allocated_capacity = 0x8e6fc0;
  (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.OwnerHistory.obj =
       (LazyObject *)
       (IfcRoot-in-Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure::construction_vtable +
       0x40);
  puVar2 = *(undefined1 **)&this[-1].super_IfcRelConnects.super_IfcRelationship.field_0xa8;
  puVar3 = &this[-1].super_IfcRelConnects.field_0xb8;
  if (puVar2 != puVar3) {
    operator_delete(puVar2,*(long *)puVar3 + 1);
  }
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Description.have;
  puVar3 = &this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.field_0x90;
  if (puVar2 != puVar3) {
    operator_delete(puVar2,*(long *)puVar3 + 1);
  }
  puVar3 = *(undefined1 **)
            &this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Name.have;
  psVar4 = &this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Description.ptr.
            _M_string_length;
  if ((size_type *)puVar3 != psVar4) {
    operator_delete(puVar3,*psVar4 + 1);
  }
  operator_delete(&this[-1].super_IfcRelConnects.super_IfcRelationship.super_IfcRoot.Name.ptr.
                   field_2,0xf0);
  return;
}

Assistant:

IfcRelContainedInSpatialStructure() : Object("IfcRelContainedInSpatialStructure") {}